

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
  _Var5;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest> *pPVar6;
  element_type *peVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  char *value_param;
  byte bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  long *plVar14;
  long *plVar15;
  _Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> *p_Var16;
  ostream *poVar17;
  size_t sVar18;
  const_iterator cVar19;
  int *piVar20;
  undefined4 extraout_var;
  undefined4 *puVar21;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar22;
  pointer pIVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  string param_name;
  string test_suite_name;
  ParamGenerator<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_330;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest> *local_328;
  element_type *local_320;
  char *local_318;
  string local_310;
  size_t local_2f0;
  char *local_2e8;
  undefined8 local_2e0;
  char local_2d8 [16];
  long *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  pointer local_2b8;
  pointer local_2b0;
  ParamNameGeneratorFunc *local_2a8;
  char *local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  CodeLocation local_268;
  char *local_240;
  char local_230 [16];
  string local_220;
  CodeLocation local_200;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b8 [16];
  _Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> local_1a8;
  _Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> _Stack_1a0;
  size_t local_198;
  ios_base local_138 [264];
  
  psVar22 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_328 = this;
  if (psVar22 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar11 = false;
    do {
      local_320 = (psVar22->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      this_00 = (psVar22->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pIVar23 = (local_328->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2b8 = psVar22;
      if (pIVar23 !=
          (local_328->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*pIVar23->generator)(&local_2c8);
          local_2a8 = pIVar23->name_func;
          pcVar2 = pIVar23->file;
          iVar13 = pIVar23->line;
          local_2e8 = local_2d8;
          local_2e0 = 0;
          local_2d8[0] = '\0';
          sVar3 = (pIVar23->name)._M_string_length;
          if (sVar3 != 0) {
            local_1b8._0_8_ = &local_1a8;
            pcVar4 = (pIVar23->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar4,pcVar4 + sVar3);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_1b8);
            if ((_Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> *)local_1b8._0_8_
                != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_);
            }
          }
          local_2b0 = pIVar23;
          std::__cxx11::string::_M_append
                    ((char *)&local_2e8,(ulong)(local_320->test_suite_base_name)._M_dataplus._M_p);
          local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_298._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_298._M_impl.super__Rb_tree_header._M_header;
          local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_298._M_impl.super__Rb_tree_header._M_header._M_right =
               local_298._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar14 = (long *)(**(code **)(*local_2c8 + 0x10))();
          local_2f0 = 0;
          local_318 = pcVar2;
          while( true ) {
            plVar15 = (long *)(**(code **)(*local_2c8 + 0x18))();
            if (plVar14 == plVar15) {
              bVar10 = 0;
            }
            else {
              bVar10 = (**(code **)(*plVar14 + 0x30))(plVar14,plVar15);
              bVar10 = bVar10 ^ 1;
            }
            if (plVar15 != (long *)0x0) {
              (**(code **)(*plVar15 + 8))(plVar15);
            }
            if (bVar10 == 0) break;
            Message::Message((Message *)&local_330);
            p_Var16 = (_Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth> *)
                      (**(code **)(*plVar14 + 0x28))();
            local_1b8._0_8_ = *p_Var16;
            local_1b8._8_8_ = p_Var16[1];
            local_1a8 = p_Var16[2];
            _Stack_1a0 = p_Var16[3];
            local_198 = local_2f0;
            (*local_2a8)(&local_310,
                         (TestParamInfo<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
                          *)local_1b8);
            _Var9._M_p = local_310._M_dataplus._M_p;
            if (local_310._M_string_length == 0) {
              bVar11 = false;
            }
            else {
              lVar24 = local_310._M_string_length - 1;
              lVar26 = 0;
              do {
                uVar25 = (uint)(byte)_Var9._M_p[lVar26];
                iVar12 = isalnum(uVar25);
                bVar11 = iVar12 != 0 || uVar25 == 0x5f;
                if (iVar12 == 0 && uVar25 != 0x5f) break;
                bVar27 = lVar24 != lVar26;
                lVar26 = lVar26 + 1;
              } while (bVar27);
            }
            bVar11 = IsTrue(bVar11);
            pcVar2 = local_318;
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_310._M_dataplus._M_p,
                                   local_310._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\' is invalid, in ",0x11);
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
              }
              else {
                sVar18 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar2,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
              plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
              std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
              std::ostream::put((char)plVar15);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_298,&local_310);
            bVar11 = IsTrue((_Rb_tree_header *)cVar19._M_node ==
                            &local_298._M_impl.super__Rb_tree_header);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_310._M_dataplus._M_p,
                                   local_310._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\', in ",6);
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)poVar17 + (int)*(undefined8 *)(*(long *)poVar17 + -0x18));
              }
              else {
                sVar18 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar17,pcVar2,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar17," line ",6);
              plVar15 = (long *)std::ostream::operator<<(poVar17,iVar13);
              std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
              std::ostream::put((char)plVar15);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_298,&local_310);
            sVar3 = (local_320->test_base_name)._M_string_length;
            if (sVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_330._M_head_impl + 0x10),
                         (local_320->test_base_name)._M_dataplus._M_p,sVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_330._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_330._M_head_impl + 0x10),local_310._M_dataplus._M_p,
                       local_310._M_string_length);
            pcVar2 = local_2e8;
            Message::GetString_abi_cxx11_(&local_220,(Message *)&local_330);
            _Var9._M_p = local_220._M_dataplus._M_p;
            piVar20 = (int *)(**(code **)(*plVar14 + 0x28))();
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"(",1);
            FunctionPointerPrinter::
            PrintValue<void(int_const*,long,short_const*,short_const*,short_const*,short_const*,int*,int*,short_const*,unsigned_short*,short_const*,short_const*),void>
                      (*(_func_void_int_ptr_long_short_ptr_short_ptr_short_ptr_short_ptr_int_ptr_int_ptr_short_ptr_unsigned_short_ptr_short_ptr_short_ptr
                         **)(piVar20 + 6),(ostream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            FunctionPointerPrinter::
            PrintValue<void(int_const*,long,short_const*,short_const*,short_const*,short_const*,int*,int*,short_const*,unsigned_short*,short_const*,short_const*),void>
                      (*(_func_void_int_ptr_long_short_ptr_short_ptr_short_ptr_short_ptr_int_ptr_int_ptr_short_ptr_unsigned_short_ptr_short_ptr_short_ptr
                         **)(piVar20 + 4),(ostream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            PrintTo((uchar)piVar20[2],(ostream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            std::ostream::operator<<(&local_1a8,piVar20[1]);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
            std::ostream::operator<<(&local_1a8,*piVar20);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
            std::__cxx11::stringbuf::str();
            local_2a0 = _Var9._M_p;
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
            value_param = local_240;
            peVar7 = local_320;
            local_268.file._M_dataplus._M_p = (pointer)&local_268.file.field_2;
            pcVar4 = (local_320->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,pcVar4,
                       pcVar4 + (local_320->code_location).file._M_string_length);
            local_268.line = (peVar7->code_location).line;
            iVar12 = (*(local_328->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar8 = local_318;
              if (local_318 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar18 = strlen(local_318);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar8,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar13);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            bVar11 = IsTrue(true);
            if (!bVar11) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar8 = local_318;
              if (local_318 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar18 = strlen(local_318);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar8,sVar18);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar13);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            _Var5.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_false>
            ._M_head_impl =
                 (local_320->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_false>
            ;
            puVar21 = (undefined4 *)(**(code **)(*plVar14 + 0x28))();
            local_1d8 = *puVar21;
            uStack_1d4 = puVar21[1];
            uStack_1d0 = puVar21[2];
            uStack_1cc = puVar21[3];
            local_1c8 = puVar21[4];
            uStack_1c4 = puVar21[5];
            uStack_1c0 = puVar21[6];
            uStack_1bc = puVar21[7];
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var5.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var5.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_int_*,_long,_const_short_*,_const_short_*,_const_short_*,_const_short_*,_int_*,_int_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>_*,_false>
                                 ._M_head_impl,&local_1d8);
            MakeAndRegisterTestInfo
                      (pcVar2,local_2a0,(char *)0x0,value_param,&local_268,
                       (TypeId)CONCAT44(extraout_var,iVar12),(SetUpTestSuiteFunc)0x0,
                       (TearDownTestSuiteFunc)0x0,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268.file._M_dataplus._M_p != &local_268.file.field_2) {
              operator_delete(local_268.file._M_dataplus._M_p);
            }
            if (local_240 != local_230) {
              operator_delete(local_240);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p);
            }
            if (local_330._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_330._M_head_impl + 8))();
            }
            (**(code **)(*plVar14 + 0x18))();
            local_2f0 = local_2f0 + 1;
            bVar11 = true;
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_298);
          if (local_2e8 != local_2d8) {
            operator_delete(local_2e8);
          }
          if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
          }
          pIVar23 = local_2b0 + 1;
        } while (pIVar23 !=
                 (local_328->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar22 = local_2b8 + 1;
    } while (psVar22 !=
             (local_328->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar11) {
      return;
    }
  }
  pPVar6 = local_328;
  iVar13 = (*(local_328->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_328);
  paVar1 = &local_200.file.field_2;
  pcVar4 = (pPVar6->code_location_).file._M_dataplus._M_p;
  local_200.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar4,pcVar4 + (pPVar6->code_location_).file._M_string_length);
  local_200.line = (pPVar6->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar13),&local_200,
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar6->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::FullPrecisionQuantizeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_200.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }